

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128i _sh00_2;
  __m128i _sl00_2;
  __m128i _w0_3;
  __m128i _w01_3;
  __m128i _val0_2;
  __m128i _val01_2;
  int j_3;
  __m128i _sum1_2;
  __m128i _sum0_2;
  int nn_3;
  char *kptr0_3;
  char *tmpptr_5;
  __m128i _sh10_1;
  __m128i _sl10_1;
  __m128i _sh00_1;
  __m128i _sl00_1;
  __m128i _w0_2;
  __m128i _w01_2;
  __m128i _val1_1;
  __m128i _val0_1;
  __m128i _extval01_1;
  __m128i _val01_1;
  int j_2;
  __m128i _sum3_1;
  __m128i _sum2_1;
  __m128i _sum1_1;
  __m128i _sum0_1;
  int nn_2;
  char *kptr0_2;
  char *tmpptr_4;
  int i_3;
  int *outptr0_1;
  int p_1;
  int sum_1 [4];
  __m128i _tmp3_2;
  __m128i _tmp2_2;
  __m128i _tmp1_2;
  __m128i _tmp0_2;
  __m128i _sh3;
  __m128i _sl3;
  __m128i _sh2;
  __m128i _sl2;
  __m128i _sh1;
  __m128i _sl1;
  __m128i _sh0;
  __m128i _sl0;
  __m128i _w3_1;
  __m128i _w2_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw23_1;
  __m128i _extw01_1;
  __m128i _w23_1;
  __m128i _w01_1;
  __m128i _val;
  int j_1;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn_1;
  char *kptr0_1;
  char *tmpptr_3;
  int sum [8];
  __m128i _tmp3_1;
  __m128i _tmp2_1;
  __m128i _tmp1_1;
  __m128i _tmp0_1;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _sh13;
  __m128i _sl13;
  __m128i _sh12;
  __m128i _sl12;
  __m128i _sh11;
  __m128i _sl11;
  __m128i _sh10;
  __m128i _sl10;
  __m128i _sh03;
  __m128i _sl03;
  __m128i _sh02;
  __m128i _sl02;
  __m128i _sh01;
  __m128i _sl01;
  __m128i _sh00;
  __m128i _sl00;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _extval01;
  __m128i _val01;
  int j;
  __m128i _sum13;
  __m128i _sum12;
  __m128i _sum11;
  __m128i _sum10;
  __m128i _sum03;
  __m128i _sum02;
  __m128i _sum01;
  __m128i _sum00;
  int nn;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr3;
  int *outptr2;
  int *outptr1;
  int *outptr0;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int k_1;
  int64_t *img0_1;
  int q_1;
  int64_t *tmpptr_1;
  int i_1;
  __m128i _v;
  int k;
  int64_t *img0;
  int q;
  int64_t *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_15;
  Mat *m_13;
  Mat *m_12;
  Mat *m_10;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_16;
  Mat *m_14;
  Mat *m_11;
  Mat *m_9;
  Mat *m_3;
  Mat *m_1;
  __m128i sum32_2;
  __m128i hi32_2;
  __m128i sum64_2;
  __m128i hi64_2;
  __m128i sum32_1;
  __m128i hi32_1;
  __m128i sum64_1;
  __m128i hi64_1;
  __m128i sum32;
  __m128i hi32;
  __m128i sum64;
  __m128i hi64;
  Option *in_stack_ffffffffffffcd58;
  Mat *in_stack_ffffffffffffcd60;
  Mat *in_stack_ffffffffffffcd68;
  void **ppvVar12;
  undefined4 in_stack_ffffffffffffcd70;
  int in_stack_ffffffffffffcd74;
  size_t in_stack_ffffffffffffcd78;
  undefined8 in_stack_ffffffffffffcd80;
  int _c;
  undefined8 in_stack_ffffffffffffcd88;
  undefined4 in_stack_ffffffffffffcd90;
  undefined4 in_stack_ffffffffffffcd94;
  Allocator *in_stack_ffffffffffffcdf0;
  undefined8 local_2f88;
  undefined8 uStack_2f80;
  undefined8 local_2f78;
  undefined8 uStack_2f70;
  undefined8 local_2f68;
  undefined8 uStack_2f60;
  undefined8 local_2f48;
  undefined8 uStack_2f40;
  int local_2f1c;
  undefined1 local_2f18 [16];
  undefined1 local_2f08 [16];
  undefined8 local_2ee8;
  undefined8 local_2ee0;
  undefined8 local_2ed8;
  undefined4 local_2ed0;
  long local_2ec8;
  undefined4 local_2ec0;
  undefined4 local_2ebc;
  undefined4 local_2eb8;
  undefined4 local_2eb4;
  undefined4 local_2eb0;
  undefined8 local_2ea8;
  ulong *local_2ea0;
  undefined8 local_2e98;
  undefined8 local_2e90;
  undefined8 local_2e88;
  undefined4 local_2e80;
  long *local_2e78;
  undefined4 local_2e70;
  undefined4 local_2e6c;
  undefined4 local_2e68;
  undefined4 local_2e64;
  undefined4 local_2e60;
  undefined8 local_2e58;
  ulong *local_2e50;
  undefined1 local_2e48 [16];
  undefined1 local_2e38 [16];
  undefined1 local_2e28 [16];
  undefined1 local_2e18 [16];
  undefined1 local_2e08 [16];
  ulong local_2df8;
  undefined8 uStack_2df0;
  undefined1 local_2de8 [16];
  undefined1 local_2dd8 [16];
  undefined1 local_2dc8 [16];
  undefined8 local_2db8;
  undefined8 uStack_2db0;
  int local_2d9c;
  undefined1 local_2d98 [16];
  undefined1 local_2d88 [16];
  undefined1 local_2d78 [16];
  undefined1 local_2d68 [16];
  int local_2d4c;
  undefined8 local_2d48;
  undefined8 local_2d40;
  undefined8 local_2d38;
  undefined4 local_2d30;
  long local_2d28;
  undefined4 local_2d20;
  undefined4 local_2d1c;
  undefined4 local_2d18;
  undefined4 local_2d14;
  undefined4 local_2d10;
  undefined8 local_2d08;
  ulong *local_2d00;
  undefined8 local_2cf8;
  undefined8 local_2cf0;
  undefined8 local_2ce8;
  undefined4 local_2ce0;
  long *local_2cd8;
  undefined4 local_2cd0;
  undefined4 local_2ccc;
  undefined4 local_2cc8;
  undefined4 local_2cc4;
  undefined4 local_2cc0;
  undefined8 local_2cb8;
  undefined1 (*local_2cb0) [16];
  int local_2ca4;
  undefined8 local_2ca0;
  undefined8 local_2c98;
  undefined8 local_2c90;
  undefined4 local_2c88;
  long local_2c80;
  undefined4 local_2c78;
  undefined4 local_2c74;
  undefined4 local_2c70;
  undefined4 local_2c6c;
  undefined4 local_2c68;
  undefined8 local_2c60;
  undefined4 *local_2c58;
  int local_2c4c;
  undefined4 local_2c48;
  undefined4 uStack_2c44;
  undefined4 uStack_2c40;
  undefined4 uStack_2c3c;
  undefined1 local_2c38 [16];
  undefined1 local_2c28 [16];
  undefined1 local_2c18 [16];
  undefined1 local_2c08 [16];
  undefined1 local_2bf8 [16];
  undefined1 local_2be8 [16];
  undefined1 local_2bd8 [16];
  undefined1 local_2bc8 [16];
  undefined1 local_2bb8 [16];
  undefined1 local_2ba8 [16];
  undefined1 local_2b98 [16];
  undefined1 local_2b88 [16];
  undefined1 local_2b78 [16];
  undefined1 local_2b68 [16];
  undefined1 local_2b58 [16];
  undefined1 local_2b48 [16];
  undefined1 local_2b38 [16];
  undefined1 local_2b28 [16];
  undefined8 local_2b18;
  undefined8 uStack_2b10;
  undefined8 local_2b08;
  undefined8 uStack_2b00;
  undefined1 local_2af8 [16];
  int local_2adc;
  undefined1 local_2ad8 [16];
  undefined1 local_2ac8 [16];
  undefined1 local_2ab8 [16];
  undefined1 local_2aa8 [16];
  int local_2a8c;
  undefined8 local_2a88;
  undefined8 local_2a80;
  undefined8 local_2a78;
  undefined4 local_2a70;
  long local_2a68;
  undefined4 local_2a60;
  undefined4 local_2a5c;
  undefined4 local_2a58;
  undefined4 local_2a54;
  undefined4 local_2a50;
  undefined8 local_2a48;
  undefined1 (*local_2a40) [16];
  undefined8 local_2a38;
  undefined8 local_2a30;
  undefined8 local_2a28;
  undefined4 local_2a20;
  long *local_2a18;
  undefined4 local_2a10;
  undefined4 local_2a0c;
  undefined4 local_2a08;
  undefined4 local_2a04;
  undefined4 local_2a00;
  undefined8 local_29f8;
  ulong *local_29f0;
  undefined4 local_29e8;
  undefined4 uStack_29e4;
  undefined4 uStack_29e0;
  undefined4 uStack_29dc;
  undefined4 local_29d8;
  undefined4 uStack_29d4;
  undefined4 uStack_29d0;
  undefined4 uStack_29cc;
  undefined1 local_29c8 [16];
  undefined1 local_29b8 [16];
  undefined1 local_29a8 [16];
  undefined1 local_2998 [16];
  undefined1 local_2988 [16];
  undefined1 local_2978 [16];
  undefined1 local_2968 [16];
  undefined1 local_2958 [16];
  undefined1 local_2948 [16];
  undefined1 local_2938 [16];
  undefined1 local_2928 [16];
  undefined1 local_2918 [16];
  undefined1 local_2908 [16];
  undefined1 local_28f8 [16];
  undefined1 local_28e8 [16];
  undefined1 local_28d8 [16];
  undefined1 local_28c8 [16];
  undefined1 local_28b8 [16];
  undefined1 local_28a8 [16];
  undefined1 local_2898 [16];
  undefined1 local_2888 [16];
  undefined1 local_2878 [16];
  undefined1 local_2868 [16];
  undefined1 local_2858 [16];
  undefined1 local_2848 [16];
  undefined1 local_2838 [16];
  undefined1 local_2828 [16];
  undefined1 local_2818 [16];
  undefined1 local_2808 [16];
  undefined1 local_27f8 [16];
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined1 local_27c8 [16];
  undefined1 local_27b8 [16];
  undefined1 local_27a8 [16];
  undefined8 local_2798;
  undefined8 uStack_2790;
  int local_277c;
  undefined1 local_2778 [16];
  undefined1 local_2768 [16];
  undefined1 local_2758 [16];
  undefined1 local_2748 [16];
  undefined1 local_2738 [16];
  undefined1 local_2728 [16];
  undefined1 local_2718 [16];
  undefined1 local_2708 [16];
  int local_26ec;
  undefined8 local_26e8;
  undefined8 local_26e0;
  undefined8 local_26d8;
  undefined4 local_26d0;
  long local_26c8;
  undefined4 local_26c0;
  undefined4 local_26bc;
  undefined4 local_26b8;
  undefined4 local_26b4;
  undefined4 local_26b0;
  undefined8 local_26a8;
  undefined1 (*local_26a0) [16];
  undefined8 local_2698;
  undefined8 local_2690;
  undefined8 local_2688;
  undefined4 local_2680;
  long *local_2678;
  undefined4 local_2670;
  undefined4 local_266c;
  undefined4 local_2668;
  undefined4 local_2664;
  undefined4 local_2660;
  undefined8 local_2658;
  undefined1 (*local_2650) [16];
  int local_2644;
  undefined8 local_2640;
  undefined8 local_2638;
  undefined8 local_2630;
  undefined4 local_2628;
  long local_2620;
  undefined4 local_2618;
  undefined4 local_2614;
  undefined4 local_2610;
  undefined4 local_260c;
  undefined4 local_2608;
  undefined8 local_2600;
  undefined4 *local_25f8;
  undefined8 local_25f0;
  undefined8 local_25e8;
  undefined8 local_25e0;
  undefined4 local_25d8;
  long local_25d0;
  undefined4 local_25c8;
  undefined4 local_25c4;
  undefined4 local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  undefined8 local_25b0;
  undefined4 *local_25a8;
  undefined8 local_25a0;
  undefined8 local_2598;
  undefined8 local_2590;
  undefined4 local_2588;
  long local_2580;
  undefined4 local_2578;
  undefined4 local_2574;
  undefined4 local_2570;
  undefined4 local_256c;
  undefined4 local_2568;
  undefined8 local_2560;
  undefined4 *local_2558;
  undefined8 local_2550;
  undefined8 local_2548;
  undefined8 local_2540;
  undefined4 local_2538;
  long local_2530;
  undefined4 local_2528;
  undefined4 local_2524;
  undefined4 local_2520;
  undefined4 local_251c;
  undefined4 local_2518;
  undefined8 local_2510;
  undefined4 *local_2508;
  int local_24fc;
  int local_24f8;
  int local_24f4;
  int local_24f0;
  int local_24ec;
  undefined8 local_24e8;
  undefined8 local_24e0;
  undefined8 local_24d8;
  undefined4 local_24d0;
  long local_24c8;
  undefined4 local_24c0;
  undefined4 local_24bc;
  undefined4 local_24b8;
  undefined4 local_24b4;
  undefined4 local_24b0;
  undefined8 local_24a8;
  undefined8 *local_24a0;
  int local_2494;
  undefined8 local_2490;
  undefined8 local_2488;
  undefined8 local_2480;
  undefined4 local_2478;
  long *local_2470;
  undefined4 local_2468;
  undefined4 local_2464;
  undefined4 local_2460;
  undefined4 local_245c;
  undefined4 local_2458;
  undefined8 local_2450;
  undefined8 *local_2448;
  int local_243c;
  undefined8 local_2438;
  undefined8 uStack_2430;
  int local_241c;
  undefined8 local_2418;
  undefined8 local_2410;
  undefined8 local_2408;
  undefined4 local_2400;
  long local_23f8;
  undefined4 local_23f0;
  undefined4 local_23ec;
  undefined4 local_23e8;
  undefined4 local_23e4;
  undefined4 local_23e0;
  undefined8 local_23d8;
  undefined8 *local_23d0;
  int local_23c4;
  undefined8 local_23c0;
  undefined8 local_23b8;
  undefined8 local_23b0;
  undefined4 local_23a8;
  long *local_23a0;
  undefined4 local_2398;
  undefined4 local_2394;
  undefined4 local_2390;
  undefined4 local_238c;
  undefined4 local_2388;
  undefined8 local_2380;
  undefined8 *local_2378;
  int local_236c;
  int local_2368;
  int local_2364;
  int local_2360;
  void *local_2350;
  int *local_2348;
  long local_2340;
  undefined4 local_2338;
  long *local_2330;
  undefined4 local_2328;
  int local_2324;
  int local_2320;
  undefined4 local_231c;
  undefined4 local_2318;
  long local_2310;
  int local_2308;
  int local_2304;
  int local_2300;
  int local_22fc;
  long *local_22f0;
  long *local_22e8;
  long *local_22e0;
  void **local_22d8;
  undefined8 *local_22d0;
  undefined8 *local_22c8;
  undefined8 *local_22c0;
  undefined8 *local_22b8;
  undefined8 *local_22b0;
  undefined8 *local_22a8;
  undefined8 *local_22a0;
  undefined8 *local_2298;
  undefined8 *local_2290;
  undefined8 *local_2288;
  undefined8 *local_2280;
  undefined8 *local_2278;
  undefined8 *local_2270;
  undefined8 *local_2268;
  undefined8 *local_2260;
  undefined8 *local_2258;
  undefined8 *local_2250;
  void **local_2248;
  int local_2228;
  undefined4 local_2224;
  void **local_2220;
  undefined8 *local_2210;
  undefined8 *local_2200;
  undefined8 *local_21f0;
  undefined8 *local_21e0;
  undefined8 *local_21d0;
  undefined8 *local_21c0;
  undefined8 *local_21b0;
  undefined8 *local_21a0;
  undefined8 *local_2190;
  undefined8 *local_2180;
  undefined8 *local_2170;
  undefined8 *local_2160;
  undefined8 *local_2150;
  undefined8 *local_2140;
  undefined8 *local_2130;
  undefined8 *local_2120;
  undefined8 *local_2110;
  undefined1 local_2105;
  int local_2104;
  void **local_2100;
  undefined8 *local_20f8;
  undefined1 local_20d5;
  int local_20d4;
  void **local_20d0;
  undefined8 *local_20c8;
  undefined1 local_20a5;
  int local_20a4;
  undefined8 *local_2098;
  undefined1 local_2075;
  int local_2074;
  void **local_2070;
  undefined8 *local_2068;
  undefined1 local_2045;
  int local_2044;
  void **local_2040;
  undefined8 *local_2038;
  undefined1 local_2015;
  int local_2014;
  undefined8 *local_2008;
  undefined1 local_1fe5;
  int local_1fe4;
  undefined8 *local_1fd8;
  undefined1 local_1fb5;
  int local_1fb4;
  undefined8 *local_1fa8;
  undefined1 local_1f85;
  int local_1f84;
  undefined8 *local_1f78;
  undefined1 local_1f55;
  int local_1f54;
  void **local_1f50;
  undefined8 *local_1f48;
  undefined1 local_1f25;
  int local_1f24;
  void **local_1f20;
  undefined8 *local_1f18;
  undefined1 local_1ef5;
  int local_1ef4;
  undefined8 *local_1ee8;
  undefined1 local_1ec5;
  int local_1ec4;
  undefined8 *local_1eb8;
  undefined1 local_1e95;
  int local_1e94;
  undefined8 *local_1e88;
  undefined1 local_1e65;
  int local_1e64;
  undefined8 *local_1e58;
  undefined1 local_1e35;
  int local_1e34;
  undefined8 *local_1e28;
  undefined1 local_1e05;
  int local_1e04;
  undefined8 *local_1df8;
  void *local_1cc8;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined1 local_1c98 [16];
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined1 local_1c78 [16];
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined1 local_1c18 [16];
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined1 local_1bf8 [16];
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined1 local_1bd8 [16];
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined1 local_1bb8 [16];
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined1 local_1b38 [16];
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined1 local_1b18 [16];
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined1 local_1af8 [16];
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined1 local_1ad8 [16];
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined1 local_1ab8 [16];
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined1 local_1a98 [16];
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined1 local_1a78 [16];
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined1 local_1a58 [16];
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined1 local_1978 [16];
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined1 local_1958 [16];
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined1 local_1938 [16];
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined1 local_1918 [16];
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined1 local_18f8 [16];
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined1 local_18d8 [16];
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined1 local_18b8 [16];
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined1 local_1898 [16];
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined1 local_1878 [16];
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined1 local_1858 [16];
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined1 local_1838 [16];
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined1 local_1818 [16];
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined1 local_17f8 [16];
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 local_17d8 [16];
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined1 local_17b8 [16];
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined1 local_1798 [16];
  undefined8 local_1788;
  undefined8 uStack_1780;
  long local_1778;
  undefined4 local_176c;
  long local_1768;
  long local_1760;
  undefined4 local_1754;
  int local_1750;
  int local_174c;
  undefined8 *local_1748;
  long local_1740;
  undefined4 local_1734;
  long local_1730;
  long local_1728;
  undefined4 local_171c;
  int local_1718;
  int local_1714;
  undefined8 *local_1710;
  long local_1708;
  undefined4 local_16fc;
  long local_16f8;
  undefined1 (*local_16f0) [16];
  undefined4 local_16e4;
  int local_16e0;
  int local_16dc;
  undefined8 *local_16d8;
  long local_16d0;
  undefined4 local_16c4;
  long local_16c0;
  undefined1 (*local_16b8) [16];
  undefined4 local_16ac;
  int local_16a8;
  int local_16a4;
  undefined8 *local_16a0;
  long local_1698;
  undefined4 local_168c;
  long local_1688;
  ulong *local_1680;
  undefined4 local_1674;
  int local_1670;
  int local_166c;
  undefined8 *local_1668;
  long local_1660;
  undefined4 local_1654;
  long local_1650;
  ulong *local_1648;
  undefined4 local_163c;
  int local_1638;
  int local_1634;
  undefined8 *local_1630;
  long *local_1628;
  undefined4 local_161c;
  long local_1618;
  undefined8 *local_1610;
  undefined4 local_1604;
  int local_1600;
  int local_15fc;
  undefined8 *local_15f8;
  long *local_15f0;
  undefined4 local_15e4;
  long local_15e0;
  undefined8 *local_15d8;
  undefined4 local_15cc;
  int local_15c8;
  int local_15c4;
  undefined8 *local_15c0;
  long local_15b8;
  undefined4 local_15ac;
  long local_15a8;
  undefined4 *local_15a0;
  undefined4 local_1594;
  int local_1590;
  int local_158c;
  undefined8 *local_1588;
  long local_1580;
  undefined4 local_1574;
  long local_1570;
  undefined4 *local_1568;
  undefined4 local_155c;
  int local_1558;
  int local_1554;
  undefined8 *local_1550;
  long local_1548;
  undefined4 local_153c;
  long local_1538;
  undefined4 *local_1530;
  undefined4 local_1524;
  int local_1520;
  int local_151c;
  undefined8 *local_1518;
  long local_1510;
  undefined4 local_1504;
  long local_1500;
  undefined4 *local_14f8;
  undefined4 local_14ec;
  int local_14e8;
  int local_14e4;
  undefined8 *local_14e0;
  long *local_14d8;
  undefined4 local_14cc;
  long local_14c8;
  undefined1 (*local_14c0) [16];
  undefined4 local_14b4;
  int local_14b0;
  int local_14ac;
  undefined8 *local_14a8;
  long *local_14a0;
  undefined4 local_1494;
  long local_1490;
  ulong *local_1488;
  undefined4 local_147c;
  int local_1478;
  int local_1474;
  undefined8 *local_1470;
  long local_1468;
  undefined4 local_145c;
  long local_1458;
  undefined4 *local_1450;
  undefined4 local_1444;
  int local_1440;
  int local_143c;
  undefined8 *local_1438;
  long *local_1430;
  undefined4 local_1424;
  long local_1420;
  undefined1 (*local_1418) [16];
  undefined4 local_140c;
  int local_1408;
  int local_1404;
  undefined8 *local_1400;
  long *local_13f8;
  undefined4 local_13ec;
  long local_13e8;
  ulong *local_13e0;
  undefined4 local_13d4;
  int local_13d0;
  int local_13cc;
  undefined8 *local_13c8;
  undefined4 local_13bc;
  long local_13b8;
  undefined4 local_13ac;
  long local_13a8;
  undefined4 local_139c;
  long local_1398;
  undefined4 local_138c;
  long local_1388;
  undefined4 local_137c;
  long local_1378;
  undefined4 local_136c;
  long local_1368;
  undefined4 local_135c;
  long local_1358;
  undefined4 local_134c;
  long local_1348;
  undefined4 local_133c;
  long local_1338;
  undefined4 local_132c;
  long local_1328;
  undefined4 local_131c;
  long local_1318;
  undefined4 local_130c;
  long local_1308;
  undefined4 local_12fc;
  long local_12f8;
  undefined4 local_12ec;
  long local_12e8;
  undefined4 local_12dc;
  long local_12d8;
  undefined4 local_12cc;
  long local_12c8;
  undefined4 local_12bc;
  long local_12b8;
  undefined8 *local_12b0;
  undefined8 *local_12a8;
  undefined8 *local_12a0;
  undefined8 *local_1298;
  undefined8 *local_1290;
  undefined8 *local_1288;
  undefined8 *local_1280;
  undefined8 *local_1278;
  undefined1 (*local_1270) [16];
  undefined1 (*local_1268) [16];
  undefined1 (*local_1260) [16];
  undefined1 (*local_1258) [16];
  undefined1 (*local_1250) [16];
  undefined1 (*local_1248) [16];
  undefined8 *local_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined4 *local_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined4 *local_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined4 *local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 *local_11b8;
  undefined8 *local_11b0;
  undefined8 *local_11a8;
  undefined8 *local_11a0;
  undefined8 *local_1198;
  undefined8 *local_1190;
  undefined8 *local_1188;
  undefined8 *local_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined1 local_1158 [16];
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  ulong uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  ulong uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  ulong uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  ulong uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  ulong uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  ulong uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  ulong local_338;
  undefined8 uStack_330;
  ulong *local_320;
  ulong local_318;
  undefined8 uStack_310;
  ulong *local_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e0;
  ulong local_2d8;
  undefined8 uStack_2d0;
  ulong *local_2c0;
  ulong local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  undefined8 uStack_2a0;
  ulong local_298;
  undefined8 uStack_290;
  ulong local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  _c = (int)((ulong)in_stack_ffffffffffffcd80 >> 0x20);
  local_22f0 = in_RDX;
  local_22e8 = in_RSI;
  local_22e0 = in_RDI;
  iVar11 = cpu_support_x86_avx2();
  if (iVar11 == 0) {
    iVar11 = cpu_support_x86_xop();
    if (iVar11 == 0) {
      local_22fc = *(int *)((long)local_22e0 + 0x2c);
      local_2300 = (int)local_22e0[6];
      local_2304 = (int)local_22e0[7];
      local_2308 = (int)local_22e8[7];
      local_22d8 = &local_2350;
      local_2350 = (void *)0x0;
      local_2348 = (int *)0x0;
      local_2340 = 0;
      local_2338 = 0;
      local_2330 = (long *)0x0;
      local_2328 = 0;
      local_2324 = 0;
      local_2320 = 0;
      local_231c = 0;
      local_2318 = 0;
      local_2310 = 0;
      iVar11 = (int)((ulong)in_stack_ffffffffffffcd88 >> 0x20);
      if (local_22fc < 2) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcd94,in_stack_ffffffffffffcd90),iVar11,
                    (int)in_stack_ffffffffffffcd88,_c,in_stack_ffffffffffffcd78,
                    in_stack_ffffffffffffcd74,in_stack_ffffffffffffcdf0);
      }
      else {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffcd94,in_stack_ffffffffffffcd90),iVar11,
                    (int)in_stack_ffffffffffffcd88,_c,in_stack_ffffffffffffcd78,
                    in_stack_ffffffffffffcd74,in_stack_ffffffffffffcdf0);
      }
      local_2364 = local_22fc >> 1;
      for (local_2368 = 0; local_2368 < local_2364; local_2368 = local_2368 + 1) {
        local_236c = local_2368 * 2;
        local_1f24 = local_236c / 2;
        local_1f18 = &local_23c0;
        local_1f20 = &local_2350;
        local_1610 = (undefined8 *)((long)local_2350 + local_2310 * local_1f24 * local_2340);
        local_15f8 = &local_23c0;
        local_1318 = (long)local_2324 * (long)local_2320 * local_2340;
        local_1288 = &local_23c0;
        local_22d0 = &local_23c0;
        local_23a0 = local_2330;
        local_131c = 0x10;
        local_15fc = local_2324;
        local_1600 = local_2320;
        local_1604 = local_231c;
        local_1618 = local_2340;
        local_161c = local_2338;
        local_1628 = local_2330;
        local_1f25 = 1;
        local_23c0 = 0;
        local_23b0 = 0;
        local_23a8 = 0;
        local_2398 = 0;
        local_2394 = 0;
        local_2390 = 0;
        local_238c = 0;
        local_2388 = 0;
        local_2380 = 0;
        local_23b8 = 0;
        local_2378 = local_1610;
        for (local_23c4 = 0; local_23c4 < local_2304; local_23c4 = local_23c4 + 1) {
          local_1df8 = &local_2418;
          local_174c = *(int *)((long)local_22e0 + 0x2c);
          local_1750 = (int)local_22e0[6];
          local_1754 = *(undefined4 *)((long)local_22e0 + 0x34);
          local_1760 = *local_22e0 + local_22e0[8] * (long)local_23c4 * local_22e0[2];
          local_1768 = local_22e0[2];
          local_176c = (undefined4)local_22e0[3];
          local_1778 = local_22e0[4];
          local_1748 = &local_2418;
          local_12b8 = (long)local_174c * (long)local_1750 * local_1768;
          local_1278 = &local_2418;
          local_23d0 = (undefined8 *)(local_1760 + (long)local_236c * 8);
          local_22c8 = &local_2418;
          local_12bc = 0x10;
          local_1e04 = local_23c4;
          local_1e05 = 1;
          local_2418 = 0;
          local_2408 = 0;
          local_2400 = 0;
          local_23f0 = 0;
          local_23ec = 0;
          local_23e8 = 0;
          local_23e4 = 0;
          local_23e0 = 0;
          local_23d8 = 0;
          local_2410 = 0;
          for (local_241c = 0; local_241c < local_2300; local_241c = local_241c + 1) {
            local_1240 = local_23d0;
            local_2438 = *local_23d0;
            uStack_2430 = local_23d0[1];
            local_11c8 = local_2378;
            *local_2378 = local_2438;
            local_2378[1] = uStack_2430;
            local_2378 = local_2378 + 2;
            local_23d0 = local_23d0 + local_22fc;
            local_11d8 = local_2438;
            uStack_11d0 = uStack_2430;
          }
          local_2120 = local_22c8;
          local_23f8 = local_1778;
        }
        local_2110 = local_22d0;
      }
      local_2360 = local_2364 * 2;
      for (local_243c = local_2360; local_243c < local_22fc; local_243c = local_243c + 1) {
        local_1f54 = local_243c / 2 + local_243c % 2;
        local_1f48 = &local_2490;
        local_1f50 = &local_2350;
        local_15d8 = (undefined8 *)((long)local_2350 + local_2310 * local_1f54 * local_2340);
        local_15c0 = &local_2490;
        local_1328 = (long)local_2324 * (long)local_2320 * local_2340;
        local_1290 = &local_2490;
        local_22c0 = &local_2490;
        local_2470 = local_2330;
        local_132c = 0x10;
        local_15c4 = local_2324;
        local_15c8 = local_2320;
        local_15cc = local_231c;
        local_15e0 = local_2340;
        local_15e4 = local_2338;
        local_15f0 = local_2330;
        local_1f55 = 1;
        local_2490 = 0;
        local_2480 = 0;
        local_2478 = 0;
        local_2468 = 0;
        local_2464 = 0;
        local_2460 = 0;
        local_245c = 0;
        local_2458 = 0;
        local_2450 = 0;
        local_2488 = 0;
        local_2448 = local_15d8;
        for (local_2494 = 0; local_2494 < local_2304; local_2494 = local_2494 + 1) {
          local_1e28 = &local_24e8;
          local_1714 = *(int *)((long)local_22e0 + 0x2c);
          local_1718 = (int)local_22e0[6];
          local_171c = *(undefined4 *)((long)local_22e0 + 0x34);
          local_1728 = *local_22e0 + local_22e0[8] * (long)local_2494 * local_22e0[2];
          local_1730 = local_22e0[2];
          local_1734 = (undefined4)local_22e0[3];
          local_1740 = local_22e0[4];
          local_1710 = &local_24e8;
          local_12c8 = (long)local_1714 * (long)local_1718 * local_1730;
          local_1280 = &local_24e8;
          local_24a0 = (undefined8 *)(local_1728 + (long)local_243c * 8);
          local_22b8 = &local_24e8;
          local_12cc = 0x10;
          local_1e34 = local_2494;
          local_1e35 = 1;
          local_24e8 = 0;
          local_24d8 = 0;
          local_24d0 = 0;
          local_24c0 = 0;
          local_24bc = 0;
          local_24b8 = 0;
          local_24b4 = 0;
          local_24b0 = 0;
          local_24a8 = 0;
          local_24e0 = 0;
          for (local_24ec = 0; local_24ec < local_2300; local_24ec = local_24ec + 1) {
            *local_2448 = *local_24a0;
            local_2448 = local_2448 + 1;
            local_24a0 = local_24a0 + local_22fc;
          }
          local_2140 = local_22b8;
          local_24c8 = local_1740;
        }
        local_2130 = local_22c0;
      }
      local_24f0 = local_2308 >> 2;
      for (local_24f8 = 0; local_24f8 < local_24f0; local_24f8 = local_24f8 + 1) {
        local_24fc = local_24f8 * 4;
        local_1f78 = &local_2550;
        local_158c = *(int *)((long)local_22e8 + 0x2c);
        local_1590 = (int)local_22e8[6];
        local_1594 = *(undefined4 *)((long)local_22e8 + 0x34);
        local_15a0 = (undefined4 *)(*local_22e8 + local_22e8[8] * (long)local_24fc * local_22e8[2]);
        local_15a8 = local_22e8[2];
        local_15ac = (undefined4)local_22e8[3];
        local_15b8 = local_22e8[4];
        local_1588 = &local_2550;
        local_1338 = (long)local_158c * (long)local_1590 * local_15a8;
        local_11a0 = &local_2550;
        local_22b0 = &local_2550;
        local_1fb4 = local_24fc + 1;
        local_1fa8 = &local_25a0;
        local_1554 = *(int *)((long)local_22e8 + 0x2c);
        local_1558 = (int)local_22e8[6];
        local_155c = *(undefined4 *)((long)local_22e8 + 0x34);
        local_1568 = (undefined4 *)(*local_22e8 + local_22e8[8] * (long)local_1fb4 * local_22e8[2]);
        local_1570 = local_22e8[2];
        local_1574 = (undefined4)local_22e8[3];
        local_1580 = local_22e8[4];
        local_1550 = &local_25a0;
        local_1348 = (long)local_1554 * (long)local_1558 * local_1570;
        local_11a8 = &local_25a0;
        local_22a8 = &local_25a0;
        local_1fe4 = local_24fc + 2;
        local_1fd8 = &local_25f0;
        local_151c = *(int *)((long)local_22e8 + 0x2c);
        local_1520 = (int)local_22e8[6];
        local_1524 = *(undefined4 *)((long)local_22e8 + 0x34);
        local_1530 = (undefined4 *)(*local_22e8 + local_22e8[8] * (long)local_1fe4 * local_22e8[2]);
        local_1538 = local_22e8[2];
        local_153c = (undefined4)local_22e8[3];
        local_1548 = local_22e8[4];
        local_1518 = &local_25f0;
        local_1358 = (long)local_151c * (long)local_1520 * local_1538;
        local_11b0 = &local_25f0;
        local_22a0 = &local_25f0;
        local_2014 = local_24fc + 3;
        local_2008 = &local_2640;
        local_14e4 = *(int *)((long)local_22e8 + 0x2c);
        local_14e8 = (int)local_22e8[6];
        local_14ec = *(undefined4 *)((long)local_22e8 + 0x34);
        local_14f8 = (undefined4 *)(*local_22e8 + local_22e8[8] * (long)local_2014 * local_22e8[2]);
        local_1500 = local_22e8[2];
        local_1504 = (undefined4)local_22e8[3];
        local_1510 = local_22e8[4];
        local_14e0 = &local_2640;
        local_1368 = (long)local_14e4 * (long)local_14e8 * local_1500;
        local_11b8 = &local_2640;
        local_2298 = &local_2640;
        local_2518 = 0;
        local_251c = 0;
        local_2520 = 0;
        local_2524 = 0;
        local_2538 = 0;
        local_2540 = 0;
        local_2548 = 0;
        local_2550 = 0;
        local_2568 = 0;
        local_256c = 0;
        local_2570 = 0;
        local_2574 = 0;
        local_2588 = 0;
        local_2590 = 0;
        local_2598 = 0;
        local_25a0 = 0;
        local_25b8 = 0;
        local_25bc = 0;
        local_25c0 = 0;
        local_25c4 = 0;
        local_25d8 = 0;
        local_25e0 = 0;
        local_25e8 = 0;
        local_25f0 = 0;
        local_133c = 0x10;
        local_134c = 0x10;
        local_135c = 0x10;
        local_136c = 0x10;
        local_1f85 = 1;
        local_1fb5 = 1;
        local_1fe5 = 1;
        local_2015 = 1;
        local_2510 = 0;
        local_2528 = 0;
        local_2560 = 0;
        local_2578 = 0;
        local_25b0 = 0;
        local_25c8 = 0;
        local_2640 = 0;
        local_2630 = 0;
        local_2628 = 0;
        local_2618 = 0;
        local_2614 = 0;
        local_2610 = 0;
        local_260c = 0;
        local_2608 = 0;
        local_2600 = 0;
        local_2638 = 0;
        local_25f8 = local_14f8;
        local_25a8 = local_1530;
        local_2558 = local_1568;
        local_2508 = local_15a0;
        for (local_2644 = 0; local_2644 + 1 < local_22fc; local_2644 = local_2644 + 2) {
          local_2044 = local_2644 / 2;
          local_2038 = &local_2698;
          local_2040 = &local_2350;
          local_14c0 = (undefined1 (*) [16])
                       ((long)local_2350 + local_2310 * local_2044 * local_2340);
          local_14a8 = &local_2698;
          local_1378 = (long)local_2324 * (long)local_2320 * local_2340;
          local_1180 = &local_2698;
          local_2290 = &local_2698;
          local_1e64 = local_24fc / 4;
          local_1e58 = &local_26e8;
          local_16dc = *(int *)((long)local_22f0 + 0x2c);
          local_16e0 = (int)local_22f0[6];
          local_16e4 = *(undefined4 *)((long)local_22f0 + 0x34);
          local_16f0 = (undefined1 (*) [16])
                       (*local_22f0 + local_22f0[8] * (long)local_1e64 * local_22f0[2]);
          local_16f8 = local_22f0[2];
          local_16fc = (undefined4)local_22f0[3];
          local_1708 = local_22f0[4];
          local_16d8 = &local_26e8;
          local_12d8 = (long)local_16dc * (long)local_16e0 * local_16f8;
          local_1298 = &local_26e8;
          local_2288 = &local_26e8;
          local_2660 = 0;
          local_2664 = 0;
          local_2668 = 0;
          local_266c = 0;
          local_2678 = local_2330;
          local_2680 = 0;
          local_2688 = 0;
          local_2690 = 0;
          local_2698 = 0;
          local_12dc = 0x10;
          local_137c = 0x10;
          local_14ac = local_2324;
          local_14b0 = local_2320;
          local_14b4 = local_231c;
          local_14c8 = local_2340;
          local_14cc = local_2338;
          local_14d8 = local_2330;
          local_1e65 = 1;
          local_2045 = 1;
          local_2658 = 0;
          local_2670 = 0;
          local_26e8 = 0;
          local_26d8 = 0;
          local_26d0 = 0;
          local_26c0 = 0;
          local_26bc = 0;
          local_26b8 = 0;
          local_26b4 = 0;
          local_26b0 = 0;
          local_26a8 = 0;
          local_26e0 = 0;
          local_26ec = local_2304 * local_2300;
          local_1008 = 0;
          uStack_1000 = 0;
          local_2708 = ZEXT816(0);
          local_1018 = 0;
          uStack_1010 = 0;
          local_2718 = ZEXT816(0);
          local_1028 = 0;
          uStack_1020 = 0;
          local_2728 = ZEXT816(0);
          local_1038 = 0;
          uStack_1030 = 0;
          local_2738 = ZEXT816(0);
          local_1048 = 0;
          uStack_1040 = 0;
          local_2748 = ZEXT816(0);
          local_1058 = 0;
          uStack_1050 = 0;
          local_2758 = ZEXT816(0);
          local_1068 = 0;
          uStack_1060 = 0;
          local_2768 = ZEXT816(0);
          local_1078 = 0;
          uStack_1070 = 0;
          local_2778 = ZEXT816(0);
          local_277c = 0;
          local_26a0 = local_16f0;
          local_2650 = local_14c0;
          while( true ) {
            if (local_26ec <= local_277c) break;
            local_1248 = local_2650;
            local_2798 = *(undefined8 *)*local_2650;
            uStack_2790 = *(undefined8 *)(*local_2650 + 8);
            local_10a8 = ZEXT816(0) << 0x20;
            local_f48 = 0;
            local_1088._8_8_ = SUB168(ZEXT816(0),4);
            uStack_f40 = local_1088._8_8_;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_1088._8_8_;
            local_27a8 = vpcmpgtb_avx(auVar4 << 0x40,*local_2650);
            local_e98 = local_27a8._0_8_;
            uStack_e90 = local_27a8._8_8_;
            local_27b8 = vpunpcklbw_avx(*local_2650,local_27a8);
            local_dd8 = local_27a8._0_8_;
            uStack_dd0 = local_27a8._8_8_;
            local_27c8 = vpunpckhbw_avx(*local_2650,local_27a8);
            local_1250 = local_26a0;
            local_27d8 = *(undefined8 *)*local_26a0;
            uStack_27d0 = *(undefined8 *)(*local_26a0 + 8);
            local_1258 = local_26a0 + 1;
            local_27e8 = *(undefined8 *)*local_1258;
            uStack_27e0 = *(undefined8 *)(local_26a0[1] + 8);
            local_f68 = 0;
            uStack_f60 = local_1088._8_8_;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_1088._8_8_;
            local_27f8 = vpcmpgtb_avx(auVar5 << 0x40,*local_26a0);
            local_f88 = 0;
            uStack_f80 = local_1088._8_8_;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_1088._8_8_;
            local_2808 = vpcmpgtb_avx(auVar6 << 0x40,*local_1258);
            local_eb8 = local_27f8._0_8_;
            uStack_eb0 = local_27f8._8_8_;
            local_2818 = vpunpcklbw_avx(*local_26a0,local_27f8);
            local_df8 = local_27f8._0_8_;
            uStack_df0 = local_27f8._8_8_;
            local_2828 = vpunpckhbw_avx(*local_26a0,local_27f8);
            local_ed8 = local_2808._0_8_;
            uStack_ed0 = local_2808._8_8_;
            local_2838 = vpunpcklbw_avx(*local_1258,local_2808);
            local_e18 = local_2808._0_8_;
            uStack_e10 = local_2808._8_8_;
            local_2848 = vpunpckhbw_avx(*local_1258,local_2808);
            local_be8 = local_27b8._0_8_;
            uStack_be0 = local_27b8._8_8_;
            local_bf8 = local_2818._0_8_;
            uStack_bf0 = local_2818._8_8_;
            local_2858 = vpmullw_avx(local_27b8,local_2818);
            local_a08 = local_27b8._0_8_;
            uStack_a00 = local_27b8._8_8_;
            local_a18 = local_2818._0_8_;
            uStack_a10 = local_2818._8_8_;
            local_2868 = vpmulhw_avx(local_27b8,local_2818);
            local_c08 = local_27b8._0_8_;
            uStack_c00 = local_27b8._8_8_;
            local_c18 = local_2828._0_8_;
            uStack_c10 = local_2828._8_8_;
            local_2878 = vpmullw_avx(local_27b8,local_2828);
            local_a28 = local_27b8._0_8_;
            uStack_a20 = local_27b8._8_8_;
            local_a38 = local_2828._0_8_;
            uStack_a30 = local_2828._8_8_;
            local_2888 = vpmulhw_avx(local_27b8,local_2828);
            local_c28 = local_27b8._0_8_;
            uStack_c20 = local_27b8._8_8_;
            local_c38 = local_2838._0_8_;
            uStack_c30 = local_2838._8_8_;
            local_2898 = vpmullw_avx(local_27b8,local_2838);
            local_a48 = local_27b8._0_8_;
            uStack_a40 = local_27b8._8_8_;
            local_a58 = local_2838._0_8_;
            uStack_a50 = local_2838._8_8_;
            local_28a8 = vpmulhw_avx(local_27b8,local_2838);
            local_c48 = local_27b8._0_8_;
            uStack_c40 = local_27b8._8_8_;
            local_c58 = local_2848._0_8_;
            uStack_c50 = local_2848._8_8_;
            local_28b8 = vpmullw_avx(local_27b8,local_2848);
            local_a68 = local_27b8._0_8_;
            uStack_a60 = local_27b8._8_8_;
            local_a78 = local_2848._0_8_;
            uStack_a70 = local_2848._8_8_;
            local_28c8 = vpmulhw_avx(local_27b8,local_2848);
            local_c68 = local_27c8._0_8_;
            uStack_c60 = local_27c8._8_8_;
            local_c78 = local_2818._0_8_;
            uStack_c70 = local_2818._8_8_;
            local_28d8 = vpmullw_avx(local_27c8,local_2818);
            local_a88 = local_27c8._0_8_;
            uStack_a80 = local_27c8._8_8_;
            local_a98 = local_2818._0_8_;
            uStack_a90 = local_2818._8_8_;
            local_28e8 = vpmulhw_avx(local_27c8,local_2818);
            local_c88 = local_27c8._0_8_;
            uStack_c80 = local_27c8._8_8_;
            local_c98 = local_2828._0_8_;
            uStack_c90 = local_2828._8_8_;
            local_28f8 = vpmullw_avx(local_27c8,local_2828);
            local_aa8 = local_27c8._0_8_;
            uStack_aa0 = local_27c8._8_8_;
            local_ab8 = local_2828._0_8_;
            uStack_ab0 = local_2828._8_8_;
            local_2908 = vpmulhw_avx(local_27c8,local_2828);
            local_ca8 = local_27c8._0_8_;
            uStack_ca0 = local_27c8._8_8_;
            local_cb8 = local_2838._0_8_;
            uStack_cb0 = local_2838._8_8_;
            local_2918 = vpmullw_avx(local_27c8,local_2838);
            local_ac8 = local_27c8._0_8_;
            uStack_ac0 = local_27c8._8_8_;
            local_ad8 = local_2838._0_8_;
            uStack_ad0 = local_2838._8_8_;
            local_2928 = vpmulhw_avx(local_27c8,local_2838);
            local_cc8 = local_27c8._0_8_;
            uStack_cc0 = local_27c8._8_8_;
            local_cd8 = local_2848._0_8_;
            uStack_cd0 = local_2848._8_8_;
            local_2938 = vpmullw_avx(local_27c8,local_2848);
            local_ae8 = local_27c8._0_8_;
            uStack_ae0 = local_27c8._8_8_;
            local_af8 = local_2848._0_8_;
            uStack_af0 = local_2848._8_8_;
            local_2948 = vpmulhw_avx(local_27c8,local_2848);
            local_1788 = local_2708._0_8_;
            uStack_1780 = local_2708._8_8_;
            local_828 = local_2858._0_8_;
            uStack_820 = local_2858._8_8_;
            local_838 = local_2868._0_8_;
            uStack_830 = local_2868._8_8_;
            local_1798 = vpunpcklwd_avx(local_2858,local_2868);
            auVar4 = vpaddd_avx(local_2708,local_1798);
            local_17a8 = local_2718._0_8_;
            uStack_17a0 = local_2718._8_8_;
            local_848 = local_2878._0_8_;
            uStack_840 = local_2878._8_8_;
            local_858 = local_2888._0_8_;
            uStack_850 = local_2888._8_8_;
            local_17b8 = vpunpcklwd_avx(local_2878,local_2888);
            auVar5 = vpaddd_avx(local_2718,local_17b8);
            local_17c8 = local_2728._0_8_;
            uStack_17c0 = local_2728._8_8_;
            local_868 = local_2898._0_8_;
            uStack_860 = local_2898._8_8_;
            local_878 = local_28a8._0_8_;
            uStack_870 = local_28a8._8_8_;
            local_17d8 = vpunpcklwd_avx(local_2898,local_28a8);
            auVar6 = vpaddd_avx(local_2728,local_17d8);
            local_17e8 = local_2738._0_8_;
            uStack_17e0 = local_2738._8_8_;
            local_888 = local_28b8._0_8_;
            uStack_880 = local_28b8._8_8_;
            local_898 = local_28c8._0_8_;
            uStack_890 = local_28c8._8_8_;
            local_17f8 = vpunpcklwd_avx(local_28b8,local_28c8);
            auVar7 = vpaddd_avx(local_2738,local_17f8);
            local_2708._0_8_ = auVar4._0_8_;
            local_1808 = local_2708._0_8_;
            local_2708._8_8_ = auVar4._8_8_;
            uStack_1800 = local_2708._8_8_;
            local_648 = local_2858._0_8_;
            uStack_640 = local_2858._8_8_;
            local_658 = local_2868._0_8_;
            uStack_650 = local_2868._8_8_;
            local_1818 = vpunpckhwd_avx(local_2858,local_2868);
            local_2708 = vpaddd_avx(auVar4,local_1818);
            local_2718._0_8_ = auVar5._0_8_;
            local_1828 = local_2718._0_8_;
            local_2718._8_8_ = auVar5._8_8_;
            uStack_1820 = local_2718._8_8_;
            local_668 = local_2878._0_8_;
            uStack_660 = local_2878._8_8_;
            local_678 = local_2888._0_8_;
            uStack_670 = local_2888._8_8_;
            local_1838 = vpunpckhwd_avx(local_2878,local_2888);
            local_2718 = vpaddd_avx(auVar5,local_1838);
            local_2728._0_8_ = auVar6._0_8_;
            local_1848 = local_2728._0_8_;
            local_2728._8_8_ = auVar6._8_8_;
            uStack_1840 = local_2728._8_8_;
            local_688 = local_2898._0_8_;
            uStack_680 = local_2898._8_8_;
            local_698 = local_28a8._0_8_;
            uStack_690 = local_28a8._8_8_;
            local_1858 = vpunpckhwd_avx(local_2898,local_28a8);
            local_2728 = vpaddd_avx(auVar6,local_1858);
            local_2738._0_8_ = auVar7._0_8_;
            local_1868 = local_2738._0_8_;
            local_2738._8_8_ = auVar7._8_8_;
            uStack_1860 = local_2738._8_8_;
            local_6a8 = local_28b8._0_8_;
            uStack_6a0 = local_28b8._8_8_;
            local_6b8 = local_28c8._0_8_;
            uStack_6b0 = local_28c8._8_8_;
            local_1878 = vpunpckhwd_avx(local_28b8,local_28c8);
            local_2738 = vpaddd_avx(auVar7,local_1878);
            local_1888 = local_2748._0_8_;
            uStack_1880 = local_2748._8_8_;
            local_8a8 = local_28d8._0_8_;
            uStack_8a0 = local_28d8._8_8_;
            local_8b8 = local_28e8._0_8_;
            uStack_8b0 = local_28e8._8_8_;
            local_1898 = vpunpcklwd_avx(local_28d8,local_28e8);
            auVar4 = vpaddd_avx(local_2748,local_1898);
            local_18a8 = local_2758._0_8_;
            uStack_18a0 = local_2758._8_8_;
            local_8c8 = local_28f8._0_8_;
            uStack_8c0 = local_28f8._8_8_;
            local_8d8 = local_2908._0_8_;
            uStack_8d0 = local_2908._8_8_;
            local_18b8 = vpunpcklwd_avx(local_28f8,local_2908);
            auVar5 = vpaddd_avx(local_2758,local_18b8);
            local_18c8 = local_2768._0_8_;
            uStack_18c0 = local_2768._8_8_;
            local_8e8 = local_2918._0_8_;
            uStack_8e0 = local_2918._8_8_;
            local_8f8 = local_2928._0_8_;
            uStack_8f0 = local_2928._8_8_;
            local_18d8 = vpunpcklwd_avx(local_2918,local_2928);
            auVar6 = vpaddd_avx(local_2768,local_18d8);
            local_18e8 = local_2778._0_8_;
            uStack_18e0 = local_2778._8_8_;
            local_908 = local_2938._0_8_;
            uStack_900 = local_2938._8_8_;
            local_918 = local_2948._0_8_;
            uStack_910 = local_2948._8_8_;
            local_18f8 = vpunpcklwd_avx(local_2938,local_2948);
            auVar7 = vpaddd_avx(local_2778,local_18f8);
            local_2748._0_8_ = auVar4._0_8_;
            local_1908 = local_2748._0_8_;
            local_2748._8_8_ = auVar4._8_8_;
            uStack_1900 = local_2748._8_8_;
            local_6c8 = local_28d8._0_8_;
            uStack_6c0 = local_28d8._8_8_;
            local_6d8 = local_28e8._0_8_;
            uStack_6d0 = local_28e8._8_8_;
            local_1918 = vpunpckhwd_avx(local_28d8,local_28e8);
            local_2748 = vpaddd_avx(auVar4,local_1918);
            local_2758._0_8_ = auVar5._0_8_;
            local_1928 = local_2758._0_8_;
            local_2758._8_8_ = auVar5._8_8_;
            uStack_1920 = local_2758._8_8_;
            local_6e8 = local_28f8._0_8_;
            uStack_6e0 = local_28f8._8_8_;
            local_6f8 = local_2908._0_8_;
            uStack_6f0 = local_2908._8_8_;
            local_1938 = vpunpckhwd_avx(local_28f8,local_2908);
            local_2758 = vpaddd_avx(auVar5,local_1938);
            local_2768._0_8_ = auVar6._0_8_;
            local_1948 = local_2768._0_8_;
            local_2768._8_8_ = auVar6._8_8_;
            uStack_1940 = local_2768._8_8_;
            local_708 = local_2918._0_8_;
            uStack_700 = local_2918._8_8_;
            local_718 = local_2928._0_8_;
            uStack_710 = local_2928._8_8_;
            local_1958 = vpunpckhwd_avx(local_2918,local_2928);
            local_2768 = vpaddd_avx(auVar6,local_1958);
            local_2778._0_8_ = auVar7._0_8_;
            local_1968 = local_2778._0_8_;
            local_2778._8_8_ = auVar7._8_8_;
            uStack_1960 = local_2778._8_8_;
            local_728 = local_2938._0_8_;
            uStack_720 = local_2938._8_8_;
            local_738 = local_2948._0_8_;
            uStack_730 = local_2948._8_8_;
            local_1978 = vpunpckhwd_avx(local_2938,local_2948);
            local_2778 = vpaddd_avx(auVar7,local_1978);
            local_2650 = local_2650 + 1;
            local_26a0 = local_26a0 + 2;
            local_277c = local_277c + 1;
            local_1098 = local_10a8;
            local_1088 = local_10a8;
            local_f98 = local_27e8;
            uStack_f90 = uStack_27e0;
            local_f78 = local_27d8;
            uStack_f70 = uStack_27d0;
            local_f58 = local_2798;
            uStack_f50 = uStack_2790;
            local_ec8 = local_27e8;
            uStack_ec0 = uStack_27e0;
            local_ea8 = local_27d8;
            uStack_ea0 = uStack_27d0;
            local_e88 = local_2798;
            uStack_e80 = uStack_2790;
            local_e08 = local_27e8;
            uStack_e00 = uStack_27e0;
            local_de8 = local_27d8;
            uStack_de0 = uStack_27d0;
            local_dc8 = local_2798;
            uStack_dc0 = uStack_2790;
          }
          local_588 = local_2708._0_8_;
          uStack_580 = local_2708._8_8_;
          local_598 = local_2718._0_8_;
          uStack_590 = local_2718._8_8_;
          local_2958 = vpunpckldq_avx(local_2708,local_2718);
          local_5a8 = local_2728._0_8_;
          uStack_5a0 = local_2728._8_8_;
          local_5b8 = local_2738._0_8_;
          uStack_5b0 = local_2738._8_8_;
          local_2968 = vpunpckldq_avx(local_2728,local_2738);
          local_4c8 = local_2708._0_8_;
          uStack_4c0 = local_2708._8_8_;
          local_4d8 = local_2718._0_8_;
          uStack_4d0 = local_2718._8_8_;
          local_2978 = vpunpckhdq_avx(local_2708,local_2718);
          local_4e8 = local_2728._0_8_;
          uStack_4e0 = local_2728._8_8_;
          local_4f8 = local_2738._0_8_;
          uStack_4f0 = local_2738._8_8_;
          local_2988 = vpunpckhdq_avx(local_2728,local_2738);
          local_408 = local_2958._0_8_;
          uStack_400 = local_2958._8_8_;
          local_418 = local_2968._0_8_;
          uStack_410 = local_2968._8_8_;
          auVar4 = vpunpcklqdq_avx(local_2958,local_2968);
          local_348 = local_2958._0_8_;
          uStack_340 = local_2958._8_8_;
          local_358 = local_2968._0_8_;
          uStack_350 = local_2968._8_8_;
          local_2718 = vpunpckhqdq_avx(local_2958,local_2968);
          local_428 = local_2978._0_8_;
          uStack_420 = local_2978._8_8_;
          local_438 = local_2988._0_8_;
          uStack_430 = local_2988._8_8_;
          auVar5 = vpunpcklqdq_avx(local_2978,local_2988);
          local_368 = local_2978._0_8_;
          uStack_360 = local_2978._8_8_;
          local_378 = local_2988._0_8_;
          uStack_370 = local_2988._8_8_;
          local_2738 = vpunpckhqdq_avx(local_2978,local_2988);
          local_5c8 = local_2748._0_8_;
          uStack_5c0 = local_2748._8_8_;
          local_5d8 = local_2758._0_8_;
          uStack_5d0 = local_2758._8_8_;
          local_2998 = vpunpckldq_avx(local_2748,local_2758);
          local_5e8 = local_2768._0_8_;
          uStack_5e0 = local_2768._8_8_;
          local_5f8 = local_2778._0_8_;
          uStack_5f0 = local_2778._8_8_;
          local_29a8 = vpunpckldq_avx(local_2768,local_2778);
          local_508 = local_2748._0_8_;
          uStack_500 = local_2748._8_8_;
          local_518 = local_2758._0_8_;
          uStack_510 = local_2758._8_8_;
          local_29b8 = vpunpckhdq_avx(local_2748,local_2758);
          local_528 = local_2768._0_8_;
          uStack_520 = local_2768._8_8_;
          local_538 = local_2778._0_8_;
          uStack_530 = local_2778._8_8_;
          local_29c8 = vpunpckhdq_avx(local_2768,local_2778);
          local_448 = local_2998._0_8_;
          uStack_440 = local_2998._8_8_;
          local_458 = local_29a8._0_8_;
          uStack_450 = local_29a8._8_8_;
          auVar6 = vpunpcklqdq_avx(local_2998,local_29a8);
          local_388 = local_2998._0_8_;
          uStack_380 = local_2998._8_8_;
          local_398 = local_29a8._0_8_;
          uStack_390 = local_29a8._8_8_;
          local_2758 = vpunpckhqdq_avx(local_2998,local_29a8);
          local_468 = local_29b8._0_8_;
          uStack_460 = local_29b8._8_8_;
          local_478 = local_29c8._0_8_;
          uStack_470 = local_29c8._8_8_;
          auVar7 = vpunpcklqdq_avx(local_29b8,local_29c8);
          local_3a8 = local_29b8._0_8_;
          uStack_3a0 = local_29b8._8_8_;
          local_3b8 = local_29c8._0_8_;
          uStack_3b0 = local_29c8._8_8_;
          local_2778 = vpunpckhqdq_avx(local_29b8,local_29c8);
          local_2708._0_8_ = auVar4._0_8_;
          local_2708._8_8_ = auVar4._8_8_;
          local_1988 = local_2708._0_8_;
          uStack_1980 = local_2708._8_8_;
          local_1998 = local_2718._0_8_;
          uStack_1990 = local_2718._8_8_;
          auVar4 = vpaddd_avx(auVar4,local_2718);
          local_2728._0_8_ = auVar5._0_8_;
          local_2728._8_8_ = auVar5._8_8_;
          local_19a8 = local_2728._0_8_;
          uStack_19a0 = local_2728._8_8_;
          local_19b8 = local_2738._0_8_;
          uStack_19b0 = local_2738._8_8_;
          local_2728 = vpaddd_avx(auVar5,local_2738);
          local_2748._0_8_ = auVar6._0_8_;
          local_2748._8_8_ = auVar6._8_8_;
          local_19c8 = local_2748._0_8_;
          uStack_19c0 = local_2748._8_8_;
          local_19d8 = local_2758._0_8_;
          uStack_19d0 = local_2758._8_8_;
          auVar5 = vpaddd_avx(auVar6,local_2758);
          local_2768._0_8_ = auVar7._0_8_;
          local_2768._8_8_ = auVar7._8_8_;
          local_19e8 = local_2768._0_8_;
          uStack_19e0 = local_2768._8_8_;
          local_19f8 = local_2778._0_8_;
          uStack_19f0 = local_2778._8_8_;
          local_2768 = vpaddd_avx(auVar7,local_2778);
          local_2708._0_8_ = auVar4._0_8_;
          local_2708._8_8_ = auVar4._8_8_;
          local_1a08 = local_2708._0_8_;
          uStack_1a00 = local_2708._8_8_;
          local_1a18 = local_2728._0_8_;
          uStack_1a10 = local_2728._8_8_;
          local_2708 = vpaddd_avx(auVar4,local_2728);
          local_2748._0_8_ = auVar5._0_8_;
          local_2748._8_8_ = auVar5._8_8_;
          local_1a28 = local_2748._0_8_;
          uStack_1a20 = local_2748._8_8_;
          local_1a38 = local_2768._0_8_;
          uStack_1a30 = local_2768._8_8_;
          local_2748 = vpaddd_avx(auVar5,local_2768);
          local_11e0 = &local_29e8;
          local_11f8 = local_2708._0_8_;
          uStack_11f0 = local_2708._8_8_;
          uStack_29e4 = local_2708._4_4_;
          local_29e8 = local_2708._0_4_;
          uStack_29dc = local_2708._12_4_;
          uStack_29e0 = local_2708._8_4_;
          local_1200 = &local_29d8;
          local_1218 = local_2748._0_8_;
          uStack_1210 = local_2748._8_8_;
          uStack_29d4 = local_2748._4_4_;
          local_29d8 = local_2748._0_4_;
          uStack_29cc = local_2748._12_4_;
          uStack_29d0 = local_2748._8_4_;
          *local_2508 = local_29e8;
          *local_2558 = uStack_29e4;
          *local_25a8 = uStack_29e0;
          *local_25f8 = uStack_29dc;
          local_2508[1] = local_29d8;
          local_2558[1] = uStack_29d4;
          local_25a8[1] = uStack_29d0;
          local_25f8[1] = uStack_29cc;
          local_2508 = local_2508 + 2;
          local_2558 = local_2558 + 2;
          local_25a8 = local_25a8 + 2;
          local_25f8 = local_25f8 + 2;
          local_21a0 = local_2288;
          local_2190 = local_2290;
          local_26c8 = local_1708;
        }
        for (; local_2644 < local_22fc; local_2644 = local_2644 + 1) {
          local_2074 = local_2644 / 2 + local_2644 % 2;
          local_2068 = &local_2a38;
          local_2070 = &local_2350;
          local_1488 = (ulong *)((long)local_2350 + local_2310 * local_2074 * local_2340);
          local_1470 = &local_2a38;
          local_1388 = (long)local_2324 * (long)local_2320 * local_2340;
          local_1188 = &local_2a38;
          local_2280 = &local_2a38;
          local_2a18 = local_2330;
          local_138c = 0x10;
          local_1474 = local_2324;
          local_1478 = local_2320;
          local_147c = local_231c;
          local_1490 = local_2340;
          local_1494 = local_2338;
          local_14a0 = local_2330;
          local_2075 = 1;
          local_2a38 = 0;
          local_2a28 = 0;
          local_2a20 = 0;
          local_2a0c = 0;
          local_2a08 = 0;
          local_2a04 = 0;
          local_2a00 = 0;
          local_2a30 = 0;
          local_1e94 = local_24fc / 4;
          local_1e88 = &local_2a88;
          local_16a4 = *(int *)((long)local_22f0 + 0x2c);
          local_16a8 = (int)local_22f0[6];
          local_16ac = *(undefined4 *)((long)local_22f0 + 0x34);
          local_16b8 = (undefined1 (*) [16])
                       (*local_22f0 + local_22f0[8] * (long)local_1e94 * local_22f0[2]);
          local_16c0 = local_22f0[2];
          local_16c4 = (undefined4)local_22f0[3];
          local_16d0 = local_22f0[4];
          local_16a0 = &local_2a88;
          local_12e8 = (long)local_16a4 * (long)local_16a8 * local_16c0;
          local_12ec = 0x10;
          local_1e95 = 1;
          local_29f8 = 0;
          local_2a10 = 0;
          local_12a0 = &local_2a88;
          local_2278 = &local_2a88;
          local_2a88 = 0;
          local_2a78 = 0;
          local_2a70 = 0;
          local_2a60 = 0;
          local_2a5c = 0;
          local_2a58 = 0;
          local_2a54 = 0;
          local_2a50 = 0;
          local_2a48 = 0;
          local_2a80 = 0;
          local_2a8c = local_2304 * local_2300;
          local_10b8 = 0;
          uStack_10b0 = 0;
          local_2aa8 = ZEXT816(0);
          local_10c8 = 0;
          uStack_10c0 = 0;
          local_2ab8 = ZEXT816(0);
          local_10d8 = 0;
          uStack_10d0 = 0;
          local_2ac8 = ZEXT816(0);
          local_10e8 = 0;
          uStack_10e0 = 0;
          local_2ad8 = ZEXT816(0);
          local_2adc = 0;
          local_2a40 = local_16b8;
          local_29f0 = local_1488;
          while( true ) {
            if (local_2a8c <= local_2adc) break;
            local_2c0 = local_29f0;
            local_2d8 = *local_29f0;
            uStack_2d0 = 0;
            uStack_280 = 0;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_2d8;
            local_2af8 = vpmovsxbw_avx(auVar7);
            local_1260 = local_2a40;
            local_2b08 = *(undefined8 *)*local_2a40;
            uStack_2b00 = *(undefined8 *)(*local_2a40 + 8);
            local_1268 = local_2a40 + 1;
            local_2b18 = *(undefined8 *)*local_1268;
            uStack_2b10 = *(undefined8 *)(local_2a40[1] + 8);
            local_1108 = ZEXT816(0) << 0x20;
            local_fa8 = 0;
            local_10f8._8_8_ = SUB168(ZEXT816(0),4);
            uStack_fa0 = local_10f8._8_8_;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_10f8._8_8_;
            local_2b28 = vpcmpgtb_avx(auVar8 << 0x40,*local_2a40);
            local_fc8 = 0;
            uStack_fc0 = local_10f8._8_8_;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_10f8._8_8_;
            local_2b38 = vpcmpgtb_avx(auVar9 << 0x40,*local_1268);
            local_ef8 = local_2b28._0_8_;
            uStack_ef0 = local_2b28._8_8_;
            local_2b48 = vpunpcklbw_avx(*local_2a40,local_2b28);
            local_e38 = local_2b28._0_8_;
            uStack_e30 = local_2b28._8_8_;
            local_2b58 = vpunpckhbw_avx(*local_2a40,local_2b28);
            local_f18 = local_2b38._0_8_;
            uStack_f10 = local_2b38._8_8_;
            local_2b68 = vpunpcklbw_avx(*local_1268,local_2b38);
            local_e58 = local_2b38._0_8_;
            uStack_e50 = local_2b38._8_8_;
            local_2b78 = vpunpckhbw_avx(*local_1268,local_2b38);
            local_ce8 = local_2af8._0_8_;
            uStack_ce0 = local_2af8._8_8_;
            local_cf8 = local_2b48._0_8_;
            uStack_cf0 = local_2b48._8_8_;
            local_2b88 = vpmullw_avx(local_2af8,local_2b48);
            local_b08 = local_2af8._0_8_;
            uStack_b00 = local_2af8._8_8_;
            local_b18 = local_2b48._0_8_;
            uStack_b10 = local_2b48._8_8_;
            local_2b98 = vpmulhw_avx(local_2af8,local_2b48);
            local_d08 = local_2af8._0_8_;
            uStack_d00 = local_2af8._8_8_;
            local_d18 = local_2b58._0_8_;
            uStack_d10 = local_2b58._8_8_;
            local_2ba8 = vpmullw_avx(local_2af8,local_2b58);
            local_b28 = local_2af8._0_8_;
            uStack_b20 = local_2af8._8_8_;
            local_b38 = local_2b58._0_8_;
            uStack_b30 = local_2b58._8_8_;
            local_2bb8 = vpmulhw_avx(local_2af8,local_2b58);
            local_d28 = local_2af8._0_8_;
            uStack_d20 = local_2af8._8_8_;
            local_d38 = local_2b68._0_8_;
            uStack_d30 = local_2b68._8_8_;
            local_2bc8 = vpmullw_avx(local_2af8,local_2b68);
            local_b48 = local_2af8._0_8_;
            uStack_b40 = local_2af8._8_8_;
            local_b58 = local_2b68._0_8_;
            uStack_b50 = local_2b68._8_8_;
            local_2bd8 = vpmulhw_avx(local_2af8,local_2b68);
            local_d48 = local_2af8._0_8_;
            uStack_d40 = local_2af8._8_8_;
            local_d58 = local_2b78._0_8_;
            uStack_d50 = local_2b78._8_8_;
            local_2be8 = vpmullw_avx(local_2af8,local_2b78);
            local_b68 = local_2af8._0_8_;
            uStack_b60 = local_2af8._8_8_;
            local_b78 = local_2b78._0_8_;
            uStack_b70 = local_2b78._8_8_;
            local_2bf8 = vpmulhw_avx(local_2af8,local_2b78);
            local_1a48 = local_2aa8._0_8_;
            uStack_1a40 = local_2aa8._8_8_;
            local_928 = local_2b88._0_8_;
            uStack_920 = local_2b88._8_8_;
            local_938 = local_2b98._0_8_;
            uStack_930 = local_2b98._8_8_;
            local_1a58 = vpunpcklwd_avx(local_2b88,local_2b98);
            auVar4 = vpaddd_avx(local_2aa8,local_1a58);
            local_1a68 = local_2ab8._0_8_;
            uStack_1a60 = local_2ab8._8_8_;
            local_948 = local_2ba8._0_8_;
            uStack_940 = local_2ba8._8_8_;
            local_958 = local_2bb8._0_8_;
            uStack_950 = local_2bb8._8_8_;
            local_1a78 = vpunpcklwd_avx(local_2ba8,local_2bb8);
            auVar5 = vpaddd_avx(local_2ab8,local_1a78);
            local_1a88 = local_2ac8._0_8_;
            uStack_1a80 = local_2ac8._8_8_;
            local_968 = local_2bc8._0_8_;
            uStack_960 = local_2bc8._8_8_;
            local_978 = local_2bd8._0_8_;
            uStack_970 = local_2bd8._8_8_;
            local_1a98 = vpunpcklwd_avx(local_2bc8,local_2bd8);
            auVar6 = vpaddd_avx(local_2ac8,local_1a98);
            local_1aa8 = local_2ad8._0_8_;
            uStack_1aa0 = local_2ad8._8_8_;
            local_988 = local_2be8._0_8_;
            uStack_980 = local_2be8._8_8_;
            local_998 = local_2bf8._0_8_;
            uStack_990 = local_2bf8._8_8_;
            local_1ab8 = vpunpcklwd_avx(local_2be8,local_2bf8);
            auVar7 = vpaddd_avx(local_2ad8,local_1ab8);
            local_2aa8._0_8_ = auVar4._0_8_;
            local_1ac8 = local_2aa8._0_8_;
            local_2aa8._8_8_ = auVar4._8_8_;
            uStack_1ac0 = local_2aa8._8_8_;
            local_748 = local_2b88._0_8_;
            uStack_740 = local_2b88._8_8_;
            local_758 = local_2b98._0_8_;
            uStack_750 = local_2b98._8_8_;
            local_1ad8 = vpunpckhwd_avx(local_2b88,local_2b98);
            local_2aa8 = vpaddd_avx(auVar4,local_1ad8);
            local_2ab8._0_8_ = auVar5._0_8_;
            local_1ae8 = local_2ab8._0_8_;
            local_2ab8._8_8_ = auVar5._8_8_;
            uStack_1ae0 = local_2ab8._8_8_;
            local_768 = local_2ba8._0_8_;
            uStack_760 = local_2ba8._8_8_;
            local_778 = local_2bb8._0_8_;
            uStack_770 = local_2bb8._8_8_;
            local_1af8 = vpunpckhwd_avx(local_2ba8,local_2bb8);
            local_2ab8 = vpaddd_avx(auVar5,local_1af8);
            local_2ac8._0_8_ = auVar6._0_8_;
            local_1b08 = local_2ac8._0_8_;
            local_2ac8._8_8_ = auVar6._8_8_;
            uStack_1b00 = local_2ac8._8_8_;
            local_788 = local_2bc8._0_8_;
            uStack_780 = local_2bc8._8_8_;
            local_798 = local_2bd8._0_8_;
            uStack_790 = local_2bd8._8_8_;
            local_1b18 = vpunpckhwd_avx(local_2bc8,local_2bd8);
            local_2ac8 = vpaddd_avx(auVar6,local_1b18);
            local_2ad8._0_8_ = auVar7._0_8_;
            local_1b28 = local_2ad8._0_8_;
            local_2ad8._8_8_ = auVar7._8_8_;
            uStack_1b20 = local_2ad8._8_8_;
            local_7a8 = local_2be8._0_8_;
            uStack_7a0 = local_2be8._8_8_;
            local_7b8 = local_2bf8._0_8_;
            uStack_7b0 = local_2bf8._8_8_;
            local_1b38 = vpunpckhwd_avx(local_2be8,local_2bf8);
            local_2ad8 = vpaddd_avx(auVar7,local_1b38);
            local_29f0 = local_29f0 + 1;
            local_2a40 = local_2a40 + 2;
            local_2adc = local_2adc + 1;
            local_10f8 = local_1108;
            local_fd8 = local_2b18;
            uStack_fd0 = uStack_2b10;
            local_fb8 = local_2b08;
            uStack_fb0 = uStack_2b00;
            local_f08 = local_2b18;
            uStack_f00 = uStack_2b10;
            local_ee8 = local_2b08;
            uStack_ee0 = uStack_2b00;
            local_e48 = local_2b18;
            uStack_e40 = uStack_2b10;
            local_e28 = local_2b08;
            uStack_e20 = uStack_2b00;
            local_288 = local_2d8;
          }
          local_608 = local_2aa8._0_8_;
          uStack_600 = local_2aa8._8_8_;
          local_618 = local_2ab8._0_8_;
          uStack_610 = local_2ab8._8_8_;
          local_2c08 = vpunpckldq_avx(local_2aa8,local_2ab8);
          local_628 = local_2ac8._0_8_;
          uStack_620 = local_2ac8._8_8_;
          local_638 = local_2ad8._0_8_;
          uStack_630 = local_2ad8._8_8_;
          local_2c18 = vpunpckldq_avx(local_2ac8,local_2ad8);
          local_548 = local_2aa8._0_8_;
          uStack_540 = local_2aa8._8_8_;
          local_558 = local_2ab8._0_8_;
          uStack_550 = local_2ab8._8_8_;
          local_2c28 = vpunpckhdq_avx(local_2aa8,local_2ab8);
          local_568 = local_2ac8._0_8_;
          uStack_560 = local_2ac8._8_8_;
          local_578 = local_2ad8._0_8_;
          uStack_570 = local_2ad8._8_8_;
          local_2c38 = vpunpckhdq_avx(local_2ac8,local_2ad8);
          local_488 = local_2c08._0_8_;
          uStack_480 = local_2c08._8_8_;
          local_498 = local_2c18._0_8_;
          uStack_490 = local_2c18._8_8_;
          auVar4 = vpunpcklqdq_avx(local_2c08,local_2c18);
          local_3c8 = local_2c08._0_8_;
          uStack_3c0 = local_2c08._8_8_;
          local_3d8 = local_2c18._0_8_;
          uStack_3d0 = local_2c18._8_8_;
          local_2ab8 = vpunpckhqdq_avx(local_2c08,local_2c18);
          local_4a8 = local_2c28._0_8_;
          uStack_4a0 = local_2c28._8_8_;
          local_4b8 = local_2c38._0_8_;
          uStack_4b0 = local_2c38._8_8_;
          auVar5 = vpunpcklqdq_avx(local_2c28,local_2c38);
          local_3e8 = local_2c28._0_8_;
          uStack_3e0 = local_2c28._8_8_;
          local_3f8 = local_2c38._0_8_;
          uStack_3f0 = local_2c38._8_8_;
          local_2ad8 = vpunpckhqdq_avx(local_2c28,local_2c38);
          local_2aa8._0_8_ = auVar4._0_8_;
          local_2aa8._8_8_ = auVar4._8_8_;
          local_1b48 = local_2aa8._0_8_;
          uStack_1b40 = local_2aa8._8_8_;
          local_1b58 = local_2ab8._0_8_;
          uStack_1b50 = local_2ab8._8_8_;
          auVar4 = vpaddd_avx(auVar4,local_2ab8);
          local_2ac8._0_8_ = auVar5._0_8_;
          local_2ac8._8_8_ = auVar5._8_8_;
          local_1b68 = local_2ac8._0_8_;
          uStack_1b60 = local_2ac8._8_8_;
          local_1b78 = local_2ad8._0_8_;
          uStack_1b70 = local_2ad8._8_8_;
          local_2ac8 = vpaddd_avx(auVar5,local_2ad8);
          local_2aa8._0_8_ = auVar4._0_8_;
          local_2aa8._8_8_ = auVar4._8_8_;
          local_1b88 = local_2aa8._0_8_;
          uStack_1b80 = local_2aa8._8_8_;
          local_1b98 = local_2ac8._0_8_;
          uStack_1b90 = local_2ac8._8_8_;
          local_2aa8 = vpaddd_avx(auVar4,local_2ac8);
          local_1220 = &local_2c48;
          local_1238 = local_2aa8._0_8_;
          uStack_1230 = local_2aa8._8_8_;
          uStack_2c44 = local_2aa8._4_4_;
          local_2c48 = local_2aa8._0_4_;
          uStack_2c3c = local_2aa8._12_4_;
          uStack_2c40 = local_2aa8._8_4_;
          *local_2508 = local_2c48;
          *local_2558 = uStack_2c44;
          *local_25a8 = uStack_2c40;
          *local_25f8 = uStack_2c3c;
          local_2508 = local_2508 + 1;
          local_2558 = local_2558 + 1;
          local_25a8 = local_25a8 + 1;
          local_25f8 = local_25f8 + 1;
          local_21c0 = local_2278;
          local_21b0 = local_2280;
          local_2a68 = local_16d0;
        }
        local_2180 = local_2298;
        local_2170 = local_22a0;
        local_2160 = local_22a8;
        local_2150 = local_22b0;
        local_1f84 = local_24fc;
        local_2620 = local_1510;
        local_25d0 = local_1548;
        local_2580 = local_1580;
        local_2530 = local_15b8;
      }
      local_24f4 = local_24f0 * 4;
      for (local_2c4c = local_24f4; local_2c4c < local_2308; local_2c4c = local_2c4c + 1) {
        local_2098 = &local_2ca0;
        local_143c = *(int *)((long)local_22e8 + 0x2c);
        local_1440 = (int)local_22e8[6];
        local_1444 = *(undefined4 *)((long)local_22e8 + 0x34);
        local_1450 = (undefined4 *)(*local_22e8 + local_22e8[8] * (long)local_2c4c * local_22e8[2]);
        local_1458 = local_22e8[2];
        local_145c = (undefined4)local_22e8[3];
        local_1468 = local_22e8[4];
        local_1438 = &local_2ca0;
        local_1398 = (long)local_143c * (long)local_1440 * local_1458;
        local_11c0 = &local_2ca0;
        local_2270 = &local_2ca0;
        local_139c = 0x10;
        local_20a4 = local_2c4c;
        local_20a5 = 1;
        local_2ca0 = 0;
        local_2c90 = 0;
        local_2c88 = 0;
        local_2c78 = 0;
        local_2c74 = 0;
        local_2c70 = 0;
        local_2c6c = 0;
        local_2c68 = 0;
        local_2c60 = 0;
        local_2c98 = 0;
        local_2c58 = local_1450;
        for (local_2ca4 = 0; local_2ca4 + 1 < local_22fc; local_2ca4 = local_2ca4 + 2) {
          local_20d4 = local_2ca4 / 2;
          local_20c8 = &local_2cf8;
          local_20d0 = &local_2350;
          local_1418 = (undefined1 (*) [16])
                       ((long)local_2350 + local_2310 * local_20d4 * local_2340);
          local_1400 = &local_2cf8;
          local_13a8 = (long)local_2324 * (long)local_2320 * local_2340;
          local_1190 = &local_2cf8;
          local_2268 = &local_2cf8;
          local_1ec4 = local_2c4c / 4 + local_2c4c % 4;
          local_1eb8 = &local_2d48;
          local_166c = *(int *)((long)local_22f0 + 0x2c);
          local_1670 = (int)local_22f0[6];
          local_1674 = *(undefined4 *)((long)local_22f0 + 0x34);
          local_1680 = (ulong *)(*local_22f0 + local_22f0[8] * (long)local_1ec4 * local_22f0[2]);
          local_1688 = local_22f0[2];
          local_168c = (undefined4)local_22f0[3];
          local_1698 = local_22f0[4];
          local_1668 = &local_2d48;
          local_12f8 = (long)local_166c * (long)local_1670 * local_1688;
          local_12a8 = &local_2d48;
          local_2260 = &local_2d48;
          local_2cc0 = 0;
          local_2cc4 = 0;
          local_2cc8 = 0;
          local_2ccc = 0;
          local_2cd8 = local_2330;
          local_2ce0 = 0;
          local_2ce8 = 0;
          local_2cf0 = 0;
          local_2cf8 = 0;
          local_12fc = 0x10;
          local_13ac = 0x10;
          local_1404 = local_2324;
          local_1408 = local_2320;
          local_140c = local_231c;
          local_1420 = local_2340;
          local_1424 = local_2338;
          local_1430 = local_2330;
          local_1ec5 = 1;
          local_20d5 = 1;
          local_2cb8 = 0;
          local_2cd0 = 0;
          local_2d48 = 0;
          local_2d38 = 0;
          local_2d30 = 0;
          local_2d20 = 0;
          local_2d1c = 0;
          local_2d18 = 0;
          local_2d14 = 0;
          local_2d10 = 0;
          local_2d08 = 0;
          local_2d40 = 0;
          local_2d4c = local_2304 * local_2300;
          local_1118 = 0;
          uStack_1110 = 0;
          local_2d68 = ZEXT816(0);
          local_1128 = 0;
          uStack_1120 = 0;
          local_2d78 = ZEXT816(0);
          local_1138 = 0;
          uStack_1130 = 0;
          local_2d88 = ZEXT816(0);
          local_1148 = 0;
          uStack_1140 = 0;
          local_2d98 = ZEXT816(0);
          local_2d9c = 0;
          local_2d00 = local_1680;
          local_2cb0 = local_1418;
          while( true ) {
            if (local_2d4c <= local_2d9c) break;
            local_1270 = local_2cb0;
            local_2db8 = *(undefined8 *)*local_2cb0;
            uStack_2db0 = *(undefined8 *)(*local_2cb0 + 8);
            local_fe8 = 0;
            local_1158._8_8_ = SUB168(ZEXT816(0),4);
            uStack_fe0 = local_1158._8_8_;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_1158._8_8_;
            local_2dc8 = vpcmpgtb_avx(auVar10 << 0x40,*local_2cb0);
            local_f38 = local_2dc8._0_8_;
            uStack_f30 = local_2dc8._8_8_;
            local_2dd8 = vpunpcklbw_avx(*local_2cb0,local_2dc8);
            local_e78 = local_2dc8._0_8_;
            uStack_e70 = local_2dc8._8_8_;
            local_2de8 = vpunpckhbw_avx(*local_2cb0,local_2dc8);
            local_2e0 = local_2d00;
            local_2df8 = *local_2d00;
            uStack_2f0 = 0;
            uStack_2df0 = 0;
            uStack_290 = 0;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_2df8;
            local_2e08 = vpmovsxbw_avx(auVar1);
            local_d68 = local_2dd8._0_8_;
            uStack_d60 = local_2dd8._8_8_;
            local_d78 = local_2e08._0_8_;
            uStack_d70 = local_2e08._8_8_;
            local_2e18 = vpmullw_avx(local_2dd8,local_2e08);
            local_b88 = local_2dd8._0_8_;
            uStack_b80 = local_2dd8._8_8_;
            local_b98 = local_2e08._0_8_;
            uStack_b90 = local_2e08._8_8_;
            local_2e28 = vpmulhw_avx(local_2dd8,local_2e08);
            local_d88 = local_2de8._0_8_;
            uStack_d80 = local_2de8._8_8_;
            local_d98 = local_2e08._0_8_;
            uStack_d90 = local_2e08._8_8_;
            local_2e38 = vpmullw_avx(local_2de8,local_2e08);
            local_ba8 = local_2de8._0_8_;
            uStack_ba0 = local_2de8._8_8_;
            local_bb8 = local_2e08._0_8_;
            uStack_bb0 = local_2e08._8_8_;
            local_2e48 = vpmulhw_avx(local_2de8,local_2e08);
            local_1ba8 = local_2d68._0_8_;
            uStack_1ba0 = local_2d68._8_8_;
            local_9a8 = local_2e18._0_8_;
            uStack_9a0 = local_2e18._8_8_;
            local_9b8 = local_2e28._0_8_;
            uStack_9b0 = local_2e28._8_8_;
            local_1bb8 = vpunpcklwd_avx(local_2e18,local_2e28);
            local_2d68 = vpaddd_avx(local_2d68,local_1bb8);
            local_1bc8 = local_2d78._0_8_;
            uStack_1bc0 = local_2d78._8_8_;
            local_7c8 = local_2e18._0_8_;
            uStack_7c0 = local_2e18._8_8_;
            local_7d8 = local_2e28._0_8_;
            uStack_7d0 = local_2e28._8_8_;
            local_1bd8 = vpunpckhwd_avx(local_2e18,local_2e28);
            local_2d78 = vpaddd_avx(local_2d78,local_1bd8);
            local_1be8 = local_2d88._0_8_;
            uStack_1be0 = local_2d88._8_8_;
            local_9c8 = local_2e38._0_8_;
            uStack_9c0 = local_2e38._8_8_;
            local_9d8 = local_2e48._0_8_;
            uStack_9d0 = local_2e48._8_8_;
            local_1bf8 = vpunpcklwd_avx(local_2e38,local_2e48);
            local_2d88 = vpaddd_avx(local_2d88,local_1bf8);
            local_1c08 = local_2d98._0_8_;
            uStack_1c00 = local_2d98._8_8_;
            local_7e8 = local_2e38._0_8_;
            uStack_7e0 = local_2e38._8_8_;
            local_7f8 = local_2e48._0_8_;
            uStack_7f0 = local_2e48._8_8_;
            local_1c18 = vpunpckhwd_avx(local_2e38,local_2e48);
            local_2d98 = vpaddd_avx(local_2d98,local_1c18);
            local_2cb0 = local_2cb0 + 1;
            local_2d00 = local_2d00 + 1;
            local_2d9c = local_2d9c + 1;
            local_1158 = ZEXT816(0) << 0x20;
            local_ff8 = local_2db8;
            uStack_ff0 = uStack_2db0;
            local_f28 = local_2db8;
            uStack_f20 = uStack_2db0;
            local_e68 = local_2db8;
            uStack_e60 = uStack_2db0;
            local_2f8 = local_2df8;
            local_298 = local_2df8;
          }
          local_1c28 = local_2d68._0_8_;
          uStack_1c20 = local_2d68._8_8_;
          local_1c38 = local_2d78._0_8_;
          uStack_1c30 = local_2d78._8_8_;
          local_2d68 = vpaddd_avx(local_2d68,local_2d78);
          local_1c48 = local_2d88._0_8_;
          uStack_1c40 = local_2d88._8_8_;
          local_1c58 = local_2d98._0_8_;
          uStack_1c50 = local_2d98._8_8_;
          local_2d88 = vpaddd_avx(local_2d88,local_2d98);
          local_d8 = local_2d68._0_8_;
          uStack_d0 = local_2d68._8_8_;
          local_88 = local_2d68._0_8_;
          uStack_80 = local_2d68._8_8_;
          local_e8 = vpunpckhqdq_avx(local_2d68,local_2d68);
          local_98 = local_e8._0_8_;
          uStack_90 = local_e8._8_8_;
          local_a8 = local_2d68._0_8_;
          uStack_a0 = local_2d68._8_8_;
          local_f8 = vpaddd_avx(local_e8,local_2d68);
          local_108 = vpshufd_avx(local_f8,0xb1);
          local_b8 = local_f8._0_8_;
          uStack_b0 = local_f8._8_8_;
          local_c8 = local_108._0_8_;
          uStack_c0 = local_108._8_8_;
          local_118 = vpaddd_avx(local_f8,local_108);
          local_58 = local_118._0_8_;
          uStack_50 = local_118._8_8_;
          uStack_60 = local_118._8_8_;
          local_68._0_4_ = local_118._0_4_;
          *local_2c58 = (undefined4)local_68;
          local_188 = local_2d88._0_8_;
          uStack_180 = local_2d88._8_8_;
          local_138 = local_2d88._0_8_;
          uStack_130 = local_2d88._8_8_;
          local_198 = vpunpckhqdq_avx(local_2d88,local_2d88);
          local_148 = local_198._0_8_;
          uStack_140 = local_198._8_8_;
          local_158 = local_2d88._0_8_;
          uStack_150 = local_2d88._8_8_;
          local_1a8 = vpaddd_avx(local_198,local_2d88);
          local_1b8 = vpshufd_avx(local_1a8,0xb1);
          local_168 = local_1a8._0_8_;
          uStack_160 = local_1a8._8_8_;
          local_178 = local_1b8._0_8_;
          uStack_170 = local_1b8._8_8_;
          local_1c8 = vpaddd_avx(local_1a8,local_1b8);
          local_38 = local_1c8._0_8_;
          uStack_30 = local_1c8._8_8_;
          uStack_40 = local_1c8._8_8_;
          local_48._0_4_ = local_1c8._0_4_;
          local_2c58[1] = (undefined4)local_48;
          local_2c58 = local_2c58 + 2;
          local_21f0 = local_2260;
          local_21e0 = local_2268;
          local_128 = local_138;
          uStack_120 = uStack_130;
          local_78 = local_88;
          uStack_70 = uStack_80;
          local_68 = local_118._0_8_;
          local_48 = local_1c8._0_8_;
          local_2d28 = local_1698;
        }
        for (; local_2ca4 < local_22fc; local_2ca4 = local_2ca4 + 1) {
          local_2104 = local_2ca4 / 2 + local_2ca4 % 2;
          local_20f8 = &local_2e98;
          local_2100 = &local_2350;
          local_13e0 = (ulong *)((long)local_2350 + local_2310 * local_2104 * local_2340);
          local_13c8 = &local_2e98;
          local_13b8 = (long)local_2324 * (long)local_2320 * local_2340;
          local_1198 = &local_2e98;
          local_2258 = &local_2e98;
          local_1ef4 = local_2c4c / 4 + local_2c4c % 4;
          local_1ee8 = &local_2ee8;
          local_1634 = *(int *)((long)local_22f0 + 0x2c);
          local_1638 = (int)local_22f0[6];
          local_163c = *(undefined4 *)((long)local_22f0 + 0x34);
          local_1648 = (ulong *)(*local_22f0 + local_22f0[8] * (long)local_1ef4 * local_22f0[2]);
          local_1650 = local_22f0[2];
          local_1654 = (undefined4)local_22f0[3];
          local_1660 = local_22f0[4];
          local_1630 = &local_2ee8;
          local_1308 = (long)local_1634 * (long)local_1638 * local_1650;
          local_130c = 0x10;
          local_13bc = 0x10;
          local_13cc = local_2324;
          local_13d0 = local_2320;
          local_13d4 = local_231c;
          local_13e8 = local_2340;
          local_13ec = local_2338;
          local_13f8 = local_2330;
          local_12b0 = &local_2ee8;
          local_2250 = &local_2ee8;
          local_2e60 = 0;
          local_2e64 = 0;
          local_2e68 = 0;
          local_2e6c = 0;
          local_2e78 = local_2330;
          local_2e80 = 0;
          local_2e88 = 0;
          local_2e90 = 0;
          local_2e98 = 0;
          local_1ef5 = 1;
          local_2105 = 1;
          local_2e58 = 0;
          local_2e70 = 0;
          local_2ee8 = 0;
          local_2ed8 = 0;
          local_2ed0 = 0;
          local_2ec0 = 0;
          local_2ebc = 0;
          local_2eb8 = 0;
          local_2eb4 = 0;
          local_2eb0 = 0;
          local_2ea8 = 0;
          local_2ee0 = 0;
          local_1168 = 0;
          uStack_1160 = 0;
          local_2f08 = ZEXT816(0);
          local_1178 = 0;
          uStack_1170 = 0;
          local_2f18 = ZEXT816(0);
          local_2f1c = 0;
          local_2ea0 = local_1648;
          local_2e50 = local_13e0;
          while( true ) {
            if (local_2304 * local_2300 <= local_2f1c) break;
            local_300 = local_2e50;
            local_318 = *local_2e50;
            uStack_310 = 0;
            uStack_2a0 = 0;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_318;
            auVar4 = vpmovsxbw_avx(auVar2);
            local_320 = local_2ea0;
            local_338 = *local_2ea0;
            uStack_330 = 0;
            uStack_2b0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_338;
            auVar5 = vpmovsxbw_avx(auVar3);
            local_2f48 = auVar4._0_8_;
            local_da8 = local_2f48;
            uStack_2f40 = auVar4._8_8_;
            uStack_da0 = uStack_2f40;
            local_2f68 = auVar5._0_8_;
            local_db8 = local_2f68;
            uStack_2f60 = auVar5._8_8_;
            uStack_db0 = uStack_2f60;
            auVar6 = vpmullw_avx(auVar4,auVar5);
            local_bc8 = local_2f48;
            uStack_bc0 = uStack_2f40;
            local_bd8 = local_2f68;
            uStack_bd0 = uStack_2f60;
            auVar4 = vpmulhw_avx(auVar4,auVar5);
            local_1c68 = local_2f08._0_8_;
            uStack_1c60 = local_2f08._8_8_;
            local_2f78 = auVar6._0_8_;
            local_9e8 = local_2f78;
            uStack_2f70 = auVar6._8_8_;
            uStack_9e0 = uStack_2f70;
            local_2f88 = auVar4._0_8_;
            local_9f8 = local_2f88;
            uStack_2f80 = auVar4._8_8_;
            uStack_9f0 = uStack_2f80;
            local_1c78 = vpunpcklwd_avx(auVar6,auVar4);
            local_2f08 = vpaddd_avx(local_2f08,local_1c78);
            local_1c88 = local_2f18._0_8_;
            uStack_1c80 = local_2f18._8_8_;
            local_808 = local_2f78;
            uStack_800 = uStack_2f70;
            local_818 = local_2f88;
            uStack_810 = uStack_2f80;
            local_1c98 = vpunpckhwd_avx(auVar6,auVar4);
            local_2f18 = vpaddd_avx(local_2f18,local_1c98);
            local_2e50 = local_2e50 + 1;
            local_2ea0 = local_2ea0 + 1;
            local_2f1c = local_2f1c + 1;
            local_2b8 = local_338;
            local_2a8 = local_318;
          }
          local_1ca8 = local_2f08._0_8_;
          uStack_1ca0 = local_2f08._8_8_;
          local_1cb8 = local_2f18._0_8_;
          uStack_1cb0 = local_2f18._8_8_;
          auVar4 = vpaddd_avx(local_2f08,local_2f18);
          local_2f08._0_8_ = auVar4._0_8_;
          local_238 = local_2f08._0_8_;
          local_2f08._8_8_ = auVar4._8_8_;
          uStack_230 = local_2f08._8_8_;
          local_1e8 = local_2f08._0_8_;
          uStack_1e0 = local_2f08._8_8_;
          local_248 = vpunpckhqdq_avx(auVar4,auVar4);
          local_1f8 = local_248._0_8_;
          uStack_1f0 = local_248._8_8_;
          local_208 = local_2f08._0_8_;
          uStack_200 = local_2f08._8_8_;
          local_258 = vpaddd_avx(local_248,auVar4);
          local_268 = vpshufd_avx(local_258,0xb1);
          local_218 = local_258._0_8_;
          uStack_210 = local_258._8_8_;
          local_228 = local_268._0_8_;
          uStack_220 = local_268._8_8_;
          local_278 = vpaddd_avx(local_258,local_268);
          local_18 = local_278._0_8_;
          uStack_10 = local_278._8_8_;
          uStack_20 = local_278._8_8_;
          local_28._0_4_ = local_278._0_4_;
          *local_2c58 = (undefined4)local_28;
          local_2c58 = local_2c58 + 1;
          local_2210 = local_2250;
          local_2200 = local_2258;
          local_1d8 = local_1e8;
          uStack_1d0 = uStack_1e0;
          local_28 = local_278._0_8_;
          local_2ec8 = local_1660;
        }
        local_21d0 = local_2270;
        local_2c80 = local_1468;
      }
      ppvVar12 = &local_2350;
      if (local_2348 != (int *)0x0) {
        local_2224 = 0xffffffff;
        LOCK();
        local_2228 = *local_2348;
        *local_2348 = *local_2348 + -1;
        UNLOCK();
        if (local_2228 == 1) {
          local_2248 = ppvVar12;
          local_2220 = ppvVar12;
          if (local_2330 == (long *)0x0) {
            local_1cc8 = local_2350;
            if (local_2350 != (void *)0x0) {
              free(local_2350);
            }
          }
          else {
            (**(code **)(*local_2330 + 0x18))(local_2330,local_2350);
          }
        }
      }
      *ppvVar12 = (void *)0x0;
      ppvVar12[2] = (void *)0x0;
      *(undefined4 *)(ppvVar12 + 3) = 0;
      *(undefined4 *)(ppvVar12 + 5) = 0;
      *(undefined4 *)((long)ppvVar12 + 0x2c) = 0;
      *(undefined4 *)(ppvVar12 + 6) = 0;
      *(undefined4 *)((long)ppvVar12 + 0x34) = 0;
      *(undefined4 *)(ppvVar12 + 7) = 0;
      ppvVar12[8] = (void *)0x0;
      ppvVar12[1] = (void *)0x0;
    }
    else {
      im2col_sgemm_pack8to1_int8_sse_xop
                ((Mat *)CONCAT44(in_stack_ffffffffffffcd74,in_stack_ffffffffffffcd70),
                 in_stack_ffffffffffffcd68,in_stack_ffffffffffffcd60,in_stack_ffffffffffffcd58);
    }
  }
  else {
    im2col_sgemm_pack8to1_int8_sse_avx2
              ((Mat *)CONCAT44(in_stack_ffffffffffffcd74,in_stack_ffffffffffffcd70),
               in_stack_ffffffffffffcd68,in_stack_ffffffffffffcd60,in_stack_ffffffffffffcd58);
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
            __m256i _sum4_6 = _mm256_setzero_si256();
            __m256i _sum5_7 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl20_30 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh20_30 = _mm256_mulhi_epi16(_val23_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
                _sum4_6 = _mm256_add_epi32(_sum4_6, _mm256_unpacklo_epi16(_sl20_30, _sh20_30));
                _sum5_7 = _mm256_add_epi32(_sum5_7, _mm256_unpackhi_epi16(_sl20_30, _sh20_30));

                tmpptr += 32;
                kptr0 += 8;
            }

            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            _sum4_6 = _mm256_add_epi32(_sum4_6, _sum5_7);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
            __m128i _sum4 = _mm256_extracti128_si256(_sum4_6, 0);
            __m128i _sum6 = _mm256_extracti128_si256(_sum4_6, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0[2] = _mm_reduce_add_epi32(_sum4);
            outptr0[3] = _mm_reduce_add_epi32(_sum6);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl10, _sh10));
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
#else
            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 8;
                kptr0 += 8;
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}